

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::GetSemaphoreCounter
          (VulkanLogicalDevice *this,VkSemaphore TimelineSemaphore,uint64_t *pSemaphoreValue)

{
  VkResult VVar1;
  
  VVar1 = (*vkGetSemaphoreCounterValueKHR)(this->m_VkDevice,TimelineSemaphore,pSemaphoreValue);
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::GetSemaphoreCounter(VkSemaphore TimelineSemaphore, uint64_t* pSemaphoreValue) const
{
#if DILIGENT_USE_VOLK
    return vkGetSemaphoreCounterValueKHR(m_VkDevice, TimelineSemaphore, pSemaphoreValue);
#else
    UNSUPPORTED("vkGetSemaphoreCounterValueKHR is only available through Volk");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}